

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode multi_xfers_add(Curl_multi *multi,Curl_easy *data)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  CURLcode CVar4;
  uint local_38;
  uint newsize;
  uint min_unused;
  uint unused;
  uint capacity;
  Curl_easy *data_local;
  Curl_multi *multi_local;
  
  uVar2 = Curl_uint_tbl_capacity(&multi->xfers);
  uVar3 = Curl_uint_tbl_count(&multi->xfers);
  if (uVar2 >> 2 < 5) {
    local_38 = 4;
  }
  else {
    local_38 = uVar2 >> 2;
  }
  if (uVar2 - uVar3 <= local_38) {
    uVar2 = uVar2 + local_38 + 0x3f >> 6;
    CVar4 = Curl_uint_bset_resize(&multi->process,uVar2);
    if ((((CVar4 != CURLE_OK) ||
         (CVar4 = Curl_uint_bset_resize(&multi->pending,uVar2), CVar4 != CURLE_OK)) ||
        (CVar4 = Curl_uint_bset_resize(&multi->msgsent,uVar2), CVar4 != CURLE_OK)) ||
       (CVar4 = Curl_uint_tbl_resize(&multi->xfers,uVar2), CVar4 != CURLE_OK)) {
      return CURLM_OUT_OF_MEMORY;
    }
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       (0 < Curl_trc_feat_multi.log_level)) {
      Curl_trc_multi(data,"increased xfer table size to %u",(ulong)uVar2);
    }
  }
  _Var1 = Curl_uint_tbl_add(&multi->xfers,data,&data->mid);
  if (_Var1) {
    multi_local._4_4_ = CURLM_OK;
  }
  else {
    multi_local._4_4_ = CURLM_OUT_OF_MEMORY;
  }
  return multi_local._4_4_;
}

Assistant:

static CURLMcode multi_xfers_add(struct Curl_multi *multi,
                                 struct Curl_easy *data)
{
  /* We want `multi->xfers` to have "sufficient" free rows, so that we do
   * have to reuse the `mid` from a just removed easy right away.
   * Since uint_tbl and uint_bset is quite memory efficient,
   * regard less than 25% free as insufficient.
   * (for low capacities, e.g. multi_easy, 4 or less). */
  unsigned int capacity = Curl_uint_tbl_capacity(&multi->xfers);
  unsigned int unused = capacity - Curl_uint_tbl_count(&multi->xfers);
  unsigned int min_unused = CURLMAX(capacity >> 2, 4);

  if(unused <= min_unused) {
     /* make it a 64 multiple, since our bitsets frow by that and
      * small (easy_multi) grows to at least 64 on first resize. */
    unsigned int newsize = ((capacity + min_unused) + 63) / 64;
    /* Grow the bitsets first. Should one fail, we do not need
     * to downsize the already resized ones. The sets continue
     * to work properly when larger than the table, but not
     * the other way around. */
    if(Curl_uint_bset_resize(&multi->process, newsize) ||
       Curl_uint_bset_resize(&multi->pending, newsize) ||
       Curl_uint_bset_resize(&multi->msgsent, newsize) ||
       Curl_uint_tbl_resize(&multi->xfers, newsize))
      return CURLM_OUT_OF_MEMORY;
    CURL_TRC_M(data, "increased xfer table size to %u", newsize);
  }
  /* Insert the easy into the table now that MUST have room for it */
  if(!Curl_uint_tbl_add(&multi->xfers, data, &data->mid)) {
    DEBUGASSERT(0);
    return CURLM_OUT_OF_MEMORY;
  }
  return CURLM_OK;
}